

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O1

void __thiscall
libsbox::Stream::
deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Stream *this,Value *value)

{
  ushort uVar1;
  char *pcVar2;
  ContextManager *pCVar3;
  Ch *__s;
  long *local_40 [2];
  long local_30 [2];
  
  uVar1 = (value->data_).f.flags;
  if (uVar1 != 0) {
    if ((uVar1 >> 10 & 1) == 0) {
      pCVar3 = ContextManager::get();
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"JSON is incorrect","");
      (*(code *)**(undefined8 **)pCVar3)(pCVar3);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    if ((undefined1  [16])((undefined1  [16])value->data_ & (undefined1  [16])0x400000000000000) ==
        (undefined1  [16])0x0) {
      pCVar3 = ContextManager::get();
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"JSON is incorrect","");
      (*(code *)**(undefined8 **)pCVar3)(pCVar3);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    __s = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(value);
    pcVar2 = *(char **)(this + 8);
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)__s);
    return;
  }
  std::__cxx11::string::_M_replace((ulong)this,0,*(char **)(this + 8),0x14e2ea);
  return;
}

Assistant:

void Stream::deserialize_request(const rapidjson::Value &value) {
    if (value.IsNull()) {
        filename_ = "";
    } else {
        CHECK_TYPE(value, String);
        GET(filename_, value, String);
    }
}